

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

void __thiscall spvtools::Optimizer::Optimizer(Optimizer *this,spv_target_env env)

{
  spv_target_env *psVar1;
  _Head_base<0UL,_spvtools::Optimizer::Impl_*,_false> _Var2;
  
  _Var2._M_head_impl = (Impl *)operator_new(0xa0);
  (_Var2._M_head_impl)->target_env = env;
  *(undefined8 *)&((_Var2._M_head_impl)->pass_manager).consumer_ = SPV_ENV_UNIVERSAL_1_0;
  psVar1 = (spv_target_env *)((long)&(_Var2._M_head_impl)->pass_manager + 8);
  psVar1[0] = SPV_ENV_UNIVERSAL_1_0;
  psVar1[1] = SPV_ENV_UNIVERSAL_1_0;
  *(_Manager_type *)((long)&(_Var2._M_head_impl)->pass_manager + 0x10) = (_Manager_type)0x0;
  *(_Invoker_type *)((long)&(_Var2._M_head_impl)->pass_manager + 0x18) = (_Invoker_type)0x0;
  *(undefined8 *)
   &((vector<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
      *)((long)&(_Var2._M_head_impl)->pass_manager + 0x20))->
    super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
       = SPV_ENV_UNIVERSAL_1_0;
  *(pointer *)((long)&(_Var2._M_head_impl)->pass_manager + 0x28) = (pointer)0x0;
  *(pointer *)((long)&(_Var2._M_head_impl)->pass_manager + 0x30) = (pointer)0x0;
  *(ostream **)((long)&(_Var2._M_head_impl)->pass_manager + 0x38) = (ostream *)0x0;
  *(ostream **)((long)&(_Var2._M_head_impl)->pass_manager + 0x40) = (ostream *)0x0;
  *(spv_target_env *)((long)&(_Var2._M_head_impl)->pass_manager + 0x48) = SPV_ENV_UNIVERSAL_1_2;
  *(spv_validator_options *)((long)&(_Var2._M_head_impl)->pass_manager + 0x50) =
       (spv_validator_options)0x0;
  *(bool *)((long)&(_Var2._M_head_impl)->pass_manager + 0x58) = false;
  ((_Var2._M_head_impl)->live_locs)._M_h._M_buckets =
       (__node_base_ptr *)((long)&(_Var2._M_head_impl)->live_locs + 0x30);
  *(undefined8 *)((long)&(_Var2._M_head_impl)->live_locs + 8) = SPV_ENV_VULKAN_1_0;
  ((__node_base *)((long)&(_Var2._M_head_impl)->live_locs + 0x10))->_M_nxt = (_Hash_node_base *)0x0;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->live_locs + 0x18) = SPV_ENV_UNIVERSAL_1_0;
  ((_Prime_rehash_policy *)((long)&(_Var2._M_head_impl)->live_locs + 0x20))->_M_max_load_factor =
       1.0;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->live_locs + 0x28) = SPV_ENV_UNIVERSAL_1_0;
  *(__node_base_ptr *)((long)&(_Var2._M_head_impl)->live_locs + 0x30) = (__node_base_ptr)0x0;
  (this->impl_)._M_t.
  super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
  .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (env != SPV_ENV_WEBGPU_0) {
    return;
  }
  __assert_fail("env != SPV_ENV_WEBGPU_0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/optimizer.cpp"
                ,0x4e,"spvtools::Optimizer::Optimizer(spv_target_env)");
}

Assistant:

Optimizer::Optimizer(spv_target_env env) : impl_(new Impl(env)) {
  assert(env != SPV_ENV_WEBGPU_0);
}